

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O0

void __thiscall Json::StyledWriter::writeArrayValue(StyledWriter *this,Value *value)

{
  bool bVar1;
  ArrayIndex AVar2;
  size_type sVar3;
  reference pvVar4;
  StyledWriter *in_RDI;
  uint index_1;
  Value *childValue;
  uint index;
  bool hasChildValue;
  bool isArrayMultiLine;
  uint size;
  ArrayIndex in_stack_00000134;
  Value *in_stack_00000138;
  Value *in_stack_00000188;
  StyledWriter *in_stack_00000190;
  string *in_stack_ffffffffffffff38;
  string *value_00;
  StyledWriter *in_stack_ffffffffffffff40;
  StyledWriter *this_00;
  undefined4 in_stack_ffffffffffffff58;
  uint uVar5;
  undefined4 in_stack_ffffffffffffff5c;
  string local_a0 [8];
  Value *in_stack_ffffffffffffff68;
  undefined8 in_stack_ffffffffffffff70;
  StyledWriter *in_stack_ffffffffffffff80;
  uint local_78;
  allocator<char> local_71;
  string local_70 [8];
  Value *in_stack_ffffffffffffff98;
  StyledWriter *in_stack_ffffffffffffffa0;
  allocator local_39;
  Value *in_stack_ffffffffffffffc8;
  StyledWriter *in_stack_ffffffffffffffd0;
  
  AVar2 = Value::size((Value *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  if (AVar2 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&stack0xffffffffffffffc8,"[]",&local_39);
    pushValue(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffc8);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
  }
  else {
    bVar1 = isMultineArray((StyledWriter *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    if (bVar1) {
      this_00 = (StyledWriter *)&local_71;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_70,"[",(allocator *)this_00);
      writeWithIndent(this_00,in_stack_ffffffffffffff38);
      std::__cxx11::string::~string(local_70);
      std::allocator<char>::~allocator(&local_71);
      indent(in_stack_ffffffffffffff80);
      bVar1 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_RDI);
      local_78 = 0;
      while( true ) {
        Value::operator[](in_stack_00000138,in_stack_00000134);
        writeCommentBeforeValue(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
        if (((bVar1 ^ 0xffU) & 1) == 0) {
          writeIndent(in_RDI);
          writeValue(in_stack_00000190,in_stack_00000188);
        }
        else {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[](&in_RDI->childValues_,(ulong)local_78);
          writeWithIndent(this_00,in_stack_ffffffffffffff38);
        }
        local_78 = local_78 + 1;
        if (local_78 == AVar2) break;
        std::__cxx11::string::operator+=((string *)&in_RDI->document_,',');
        writeCommentAfterValueOnSameLine(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
      }
      writeCommentAfterValueOnSameLine(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
      unindent(this_00);
      value_00 = (string *)&stack0xffffffffffffff5f;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_a0,"]",(allocator *)value_00);
      writeWithIndent(this_00,value_00);
      std::__cxx11::string::~string(local_a0);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff5f);
    }
    else {
      sVar3 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&in_RDI->childValues_);
      if (sVar3 != AVar2) {
        __assert_fail("childValues_.size() == size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/lib_json/json_writer.cpp"
                      ,0x1d1,"void Json::StyledWriter::writeArrayValue(const Value &)");
      }
      std::__cxx11::string::operator+=((string *)&in_RDI->document_,"[ ");
      for (uVar5 = 0; uVar5 < AVar2; uVar5 = uVar5 + 1) {
        if (uVar5 != 0) {
          std::__cxx11::string::operator+=((string *)&in_RDI->document_,", ");
        }
        pvVar4 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](&in_RDI->childValues_,(ulong)uVar5);
        std::__cxx11::string::operator+=((string *)&in_RDI->document_,(string *)pvVar4);
      }
      std::__cxx11::string::operator+=((string *)&in_RDI->document_," ]");
    }
  }
  return;
}

Assistant:

void StyledWriter::writeArrayValue(const Value& value) {
  unsigned size = value.size();
  if (size == 0)
    pushValue("[]");
  else {
    bool isArrayMultiLine = isMultineArray(value);
    if (isArrayMultiLine) {
      writeWithIndent("[");
      indent();
      bool hasChildValue = !childValues_.empty();
      unsigned index = 0;
      for (;;) {
        const Value& childValue = value[index];
        writeCommentBeforeValue(childValue);
        if (hasChildValue)
          writeWithIndent(childValues_[index]);
        else {
          writeIndent();
          writeValue(childValue);
        }
        if (++index == size) {
          writeCommentAfterValueOnSameLine(childValue);
          break;
        }
        document_ += ',';
        writeCommentAfterValueOnSameLine(childValue);
      }
      unindent();
      writeWithIndent("]");
    } else // output on a single line
    {
      assert(childValues_.size() == size);
      document_ += "[ ";
      for (unsigned index = 0; index < size; ++index) {
        if (index > 0)
          document_ += ", ";
        document_ += childValues_[index];
      }
      document_ += " ]";
    }
  }
}